

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

void process_pending_handles(Curl_multi *multi)

{
  _Bool _Var1;
  Curl_easy *data;
  uint mid;
  uint local_1c;
  
  _Var1 = Curl_uint_bset_first(&multi->pending,&local_1c);
  if (_Var1) {
    do {
      data = Curl_multi_get_easy(multi,local_1c);
      if (data != (Curl_easy *)0x0) {
        move_pending_to_connect(multi,data);
      }
      _Var1 = Curl_uint_bset_next(&multi->pending,local_1c,&local_1c);
    } while (_Var1);
  }
  return;
}

Assistant:

static void process_pending_handles(struct Curl_multi *multi)
{
  unsigned int mid;
  if(Curl_uint_bset_first(&multi->pending, &mid)) {
    do {
      struct Curl_easy *data = Curl_multi_get_easy(multi, mid);
      DEBUGASSERT(data);
      if(data)
        move_pending_to_connect(multi, data);
    }
    while(Curl_uint_bset_next(&multi->pending, mid, &mid));
  }
}